

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.cpp
# Opt level: O0

OptionParser * __thiscall
OptionParser::getEpanet3Keyword(OptionParser *this,string *s1,string *s2,string *value)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  string *in_R8;
  allocator local_52;
  allocator local_51;
  allocator local_50;
  allocator local_4f;
  allocator local_4e;
  allocator local_4d;
  allocator local_4c;
  allocator local_4b;
  allocator local_4a;
  allocator local_49;
  allocator local_48;
  allocator local_47;
  allocator local_46;
  allocator local_45 [16];
  allocator local_35;
  int local_34;
  string *psStack_30;
  int i;
  string *value_local;
  string *s2_local;
  string *s1_local;
  OptionParser *this_local;
  
  psStack_30 = in_R8;
  value_local = value;
  s2_local = s2;
  s1_local = s1;
  this_local = this;
  local_34 = Utilities::findFullMatch(s2,epanet2Keywords);
  pcVar14 = valueOptionKeywords[0xf];
  pcVar13 = valueOptionKeywords[0xe];
  pcVar12 = valueOptionKeywords[9];
  pcVar11 = valueOptionKeywords[6];
  pcVar10 = valueOptionKeywords[2];
  pcVar9 = valueOptionKeywords[1];
  pcVar8 = valueOptionKeywords[0];
  pcVar7 = indexOptionKeywords[6];
  pcVar6 = indexOptionKeywords[3];
  pcVar5 = indexOptionKeywords[2];
  pcVar4 = indexOptionKeywords[1];
  pcVar3 = stringOptionKeywords[4];
  pcVar2 = stringOptionKeywords[3];
  pcVar1 = stringOptionKeywords[0];
  if (local_34 < 0) {
    std::__cxx11::string::string((string *)this,(string *)s2_local);
  }
  else {
    switch(local_34) {
    case 0:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,pcVar4,&local_35);
      std::allocator<char>::~allocator((allocator<char> *)&local_35);
      break;
    case 1:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,pcVar5,local_45);
      std::allocator<char>::~allocator((allocator<char> *)local_45);
      break;
    case 2:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,pcVar3,&local_46);
      std::allocator<char>::~allocator((allocator<char> *)&local_46);
      break;
    case 3:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,pcVar1,&local_47);
      std::allocator<char>::~allocator((allocator<char> *)&local_47);
      break;
    case 4:
    default:
      std::__cxx11::string::string((string *)this,(string *)s2_local);
      break;
    case 5:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,pcVar9,&local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_48);
      break;
    case 6:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,pcVar13,&local_49);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
      break;
    case 7:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,pcVar8,&local_4a);
      std::allocator<char>::~allocator((allocator<char> *)&local_4a);
      break;
    case 8:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,pcVar6,&local_4b);
      std::allocator<char>::~allocator((allocator<char> *)&local_4b);
      break;
    case 9:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,pcVar12,&local_4c);
      std::allocator<char>::~allocator((allocator<char> *)&local_4c);
      break;
    case 10:
      std::__cxx11::string::operator=(psStack_30,(string *)value_local);
      pcVar1 = indexOptionKeywords[4];
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,pcVar1,&local_4d);
      std::allocator<char>::~allocator((allocator<char> *)&local_4d);
      break;
    case 0xb:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,pcVar7,&local_4e);
      std::allocator<char>::~allocator((allocator<char> *)&local_4e);
      break;
    case 0xc:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,pcVar10,&local_4f);
      std::allocator<char>::~allocator((allocator<char> *)&local_4f);
      break;
    case 0xd:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,pcVar11,&local_50);
      std::allocator<char>::~allocator((allocator<char> *)&local_50);
      break;
    case 0xe:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,pcVar14,&local_51);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
      break;
    case 0xf:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,pcVar2,&local_52);
      std::allocator<char>::~allocator((allocator<char> *)&local_52);
    }
  }
  return this;
}

Assistant:

string OptionParser::getEpanet3Keyword(const string& s1, const string& s2,
                                       string& value)
{
    // ... check if first string matches an EPANET2 single keyword

    int i = Utilities::findFullMatch(s1, epanet2Keywords);
    if ( i < 0 ) return s1;

    // ... return the corresponding EPANET3 keyword
    //     ("i" is the index of the matching entry in epanet2Keywords)
    //

    switch(i)
    {
	case 0: return indexOptionKeywords[Options::FLOW_UNITS];
	case 1: return indexOptionKeywords[Options::PRESSURE_UNITS];
	case 2: return stringOptionKeywords[Options::HEADLOSS_MODEL];
	case 3: return stringOptionKeywords[Options::HYD_FILE_NAME];
	case 4: break;  //QUALITY keyword handled separately
	case 5: return valueOptionKeywords[Options::KIN_VISCOSITY];
	case 6: return valueOptionKeywords[Options::MOLEC_DIFFUSIVITY];
	case 7: return valueOptionKeywords[Options::SPEC_GRAVITY];
	case 8: return indexOptionKeywords[Options::MAX_TRIALS];
	case 9: return valueOptionKeywords[Options::RELATIVE_ACCURACY];
	case 10: value = s2; //make the 2nd token the option's value
             return indexOptionKeywords[Options::IF_UNBALANCED];
	case 11: return indexOptionKeywords[Options::DEMAND_PATTERN];
	case 12: return valueOptionKeywords[Options::DEMAND_MULTIPLIER];
	case 13: return valueOptionKeywords[Options::EMITTER_EXPONENT];
	case 14: return valueOptionKeywords[Options::QUAL_TOLERANCE];
	case 15: return stringOptionKeywords[Options::MAP_FILE_NAME];
    }
    return s1;
}